

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_Vel3DFromAngle
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double speed_00;
  AActor *this;
  bool bVar1;
  bool local_63;
  TAngle<double> local_60;
  TAngle<double> local_58;
  TAngle<double> local_50;
  DAngle pitch;
  DAngle angle;
  double speed;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1df8,
                  "int AF_AActor_Vel3DFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1df8,
                  "int AF_AActor_Vel3DFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  local_63 = true;
  if (this != (AActor *)0x0) {
    local_63 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_63 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1df8,
                  "int AF_AActor_Vel3DFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1df9,
                  "int AF_AActor_Vel3DFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1df9,
                  "int AF_AActor_Vel3DFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  speed_00 = param[1].field_0.f;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1dfa,
                  "int AF_AActor_Vel3DFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1dfa,
                  "int AF_AActor_Vel3DFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  TAngle<double>::TAngle(&pitch,param[2].field_0.f);
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1dfb,
                  "int AF_AActor_Vel3DFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1dfb,
                  "int AF_AActor_Vel3DFromAngle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  TAngle<double>::TAngle(&local_50,param[3].field_0.f);
  TAngle<double>::TAngle(&local_58,&local_50);
  TAngle<double>::TAngle(&local_60,&pitch);
  AActor::Vel3DFromAngle(this,&local_58,&local_60,speed_00);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Vel3DFromAngle)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(speed);
	PARAM_ANGLE(angle);
	PARAM_ANGLE(pitch);
	self->Vel3DFromAngle(pitch, angle, speed);
	return 0;
}